

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplexmain.cpp
# Opt level: O0

void freeStrings(char **s1,char **s2,char **s3,char **s4,char **s5)

{
  long *in_RCX;
  long *in_RDX;
  long *in_RSI;
  long *in_RDI;
  long *in_R8;
  
  if (*in_RDI != 0) {
    if ((void *)*in_RDI != (void *)0x0) {
      operator_delete__((void *)*in_RDI);
    }
    *in_RDI = 0;
  }
  if (*in_RSI != 0) {
    if ((void *)*in_RSI != (void *)0x0) {
      operator_delete__((void *)*in_RSI);
    }
    *in_RSI = 0;
  }
  if (*in_RDX != 0) {
    if ((void *)*in_RDX != (void *)0x0) {
      operator_delete__((void *)*in_RDX);
    }
    *in_RDX = 0;
  }
  if (*in_RCX != 0) {
    if ((void *)*in_RCX != (void *)0x0) {
      operator_delete__((void *)*in_RCX);
    }
    *in_RCX = 0;
  }
  if (*in_R8 != 0) {
    if ((void *)*in_R8 != (void *)0x0) {
      operator_delete__((void *)*in_R8);
    }
    *in_R8 = 0;
  }
  return;
}

Assistant:

static
void freeStrings(char*& s1, char*& s2, char*& s3, char*& s4, char*& s5)
{
   if(s1 != nullptr)
   {
      delete [] s1;
      s1 = nullptr;
   }

   if(s2 != nullptr)
   {
      delete [] s2;
      s2 = nullptr;
   }

   if(s3 != nullptr)
   {
      delete [] s3;
      s3 = nullptr;
   }

   if(s4 != nullptr)
   {
      delete [] s4;
      s4 = nullptr;
   }

   if(s5 != nullptr)
   {
      delete [] s5;
      s5 = nullptr;
   }
}